

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O2

bool SQCompilation::hasAnyPrefix
               (SQChar *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *prefixes)

{
  char cVar1;
  char cVar2;
  pointer pbVar3;
  int iVar4;
  uint i;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prefix;
  pointer pbVar6;
  
  pbVar6 = (prefixes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar3 = (prefixes->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (pbVar6 == pbVar3) {
LAB_0014c08a:
      return pbVar6 != pbVar3;
    }
    uVar5 = 0;
    do {
      cVar1 = (pbVar6->_M_dataplus)._M_p[uVar5];
      cVar2 = str[uVar5];
      if (cVar1 == '\0') {
        if (((cVar2 == '\0') || (cVar2 == '_')) || (iVar4 = tolower((int)cVar2), iVar4 != cVar2))
        goto LAB_0014c08a;
        break;
      }
      uVar5 = (ulong)((int)uVar5 + 1);
    } while (cVar2 == cVar1);
    pbVar6 = pbVar6 + 1;
  } while( true );
}

Assistant:

static bool hasAnyPrefix(const SQChar *str, const std::vector<std::string> &prefixes) {
  for (auto &prefix : prefixes) {
    unsigned length = 0;
    if (hasPrefix(str, prefix.c_str(), length)) {
      SQChar c = str[length];
      if (!c || c == '_' || c != tolower(c)) {
        return true;
      }
    }
  }

  return false;
}